

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void __thiscall llvm::SourceMgr::SrcBuffer::~SrcBuffer(SrcBuffer *this)

{
  bool bVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_03;
  SrcBuffer *this_local;
  
  bVar1 = PointerUnion4<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
          ::isNull(&this->OffsetCache);
  if (!bVar1) {
    iVar2 = PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
            ::is<std::vector<unsigned_char,std::allocator<unsigned_char>>*>
                      ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                        *)&this->OffsetCache);
    if (iVar2 == 0) {
      iVar2 = PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
              ::is<std::vector<unsigned_short,std::allocator<unsigned_short>>*>
                        ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                          *)&this->OffsetCache);
      if (iVar2 == 0) {
        iVar2 = PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                ::is<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                          ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                            *)&this->OffsetCache);
        if (iVar2 == 0) {
          this_03 = PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                    ::get<std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                              ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                                *)&this->OffsetCache);
          if (this_03 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_03);
            operator_delete(this_03,0x18);
          }
        }
        else {
          this_02 = PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                    ::get<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                              ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                                *)&this->OffsetCache);
          if (this_02 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_02);
            operator_delete(this_02,0x18);
          }
        }
      }
      else {
        this_01 = PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                  ::get<std::vector<unsigned_short,std::allocator<unsigned_short>>*>
                            ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                              *)&this->OffsetCache);
        if (this_01 != (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(this_01);
          operator_delete(this_01,0x18);
        }
      }
    }
    else {
      this_00 = PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                ::get<std::vector<unsigned_char,std::allocator<unsigned_char>>*>
                          ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                            *)&this->OffsetCache);
      if (this_00 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
        operator_delete(this_00,0x18);
      }
    }
    PointerUnion4<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    ::operator=(&this->OffsetCache,(nullptr_t)0x0);
  }
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (&this->Buffer);
  return;
}

Assistant:

SourceMgr::SrcBuffer::~SrcBuffer() {
  if (!OffsetCache.isNull()) {
    if (OffsetCache.is<std::vector<uint8_t>*>())
      delete OffsetCache.get<std::vector<uint8_t>*>();
    else if (OffsetCache.is<std::vector<uint16_t>*>())
      delete OffsetCache.get<std::vector<uint16_t>*>();
    else if (OffsetCache.is<std::vector<uint32_t>*>())
      delete OffsetCache.get<std::vector<uint32_t>*>();
    else
      delete OffsetCache.get<std::vector<uint64_t>*>();
    OffsetCache = nullptr;
  }
}